

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

void generate_gauss(kernel_t *ker,float sig)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  float fVar4;
  undefined4 in_XMM0_Db;
  double dVar5;
  double dVar6;
  
  fVar4 = (float)(double)CONCAT44(in_XMM0_Db,sig);
  dVar6 = (double)fVar4;
  ker->f = 0.0;
  uVar2 = (int)(dVar6 * 6.0 + 1.0) | 1;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    iVar1 = (int)((double)(int)uVar2 * 0.5);
    for (lVar3 = (long)-iVar1; lVar3 <= iVar1; lVar3 = lVar3 + 1) {
      dVar5 = exp((-(double)(int)lVar3 * (double)(int)lVar3) / (dVar6 * dVar6 + dVar6 * dVar6));
      fVar4 = (float)(dVar5 / (dVar6 * 2.5066282746310002));
      ker->k[iVar1 + lVar3] = fVar4;
      ker->f = fVar4 + ker->f;
    }
  }
  else {
    ker->k[0] = 1.0;
    ker->f = 1.0;
  }
  ker->m = uVar2;
  return;
}

Assistant:

void generate_gauss(ker,sig)
kernel_t *ker ;
float sig ;

{ int i, h ;

  h = (int)(sig*6.0 + 1.0) ;
  if (h%2 == 0) {
    h++ ;
  }
  (*ker).f = 0.0 ;
  if (sig != 0.0) {
    for (i = -(int)(h/2.0) ; i <= (int)(h/2.0) ; i++) {
      (*ker).k[i+(int)(h/2.0)] = exp(-pow((float)i,2.0)/(2.0*pow(sig,2.0)))/
      (sqrt(2.0*M_PI)*sig) ;
      (*ker).f += (*ker).k[i+(int)(h/2.0)] ;
    }
  }
  else {
    (*ker).k[0] = 1.0 ;
    (*ker).f = 1.0 ;
  }
  (*ker).m = h ;
}